

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O1

void test_register_event_fails(void)

{
  cio_error cVar1;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [3];
  cio_event_notifier ev;
  cio_eventloop loop;
  _func_int_int_int_int_epoll_event_ptr *local_538;
  code *pcStack_530;
  code *local_528;
  cio_event_notifier local_520;
  cio_eventloop local_500;
  
  epoll_ctl_fake.custom_fake_seq = &local_538;
  local_528 = epoll_ctl_mod_fail;
  local_538 = epoll_ctl_save;
  pcStack_530 = epoll_ctl_save;
  epoll_ctl_fake.custom_fake_seq_len = 3;
  memset(&local_500,0,0x4e8);
  cVar1 = cio_eventloop_init(&local_500);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x1be,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x1bf,UNITY_DISPLAY_STYLE_INT);
  local_520.fd = 0x2a;
  local_520.read_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
  local_520.context = (void *)0x0;
  cVar1 = cio_linux_eventloop_add(&local_500,&local_520);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x1c6,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_read(&local_500,&local_520);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (4,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x1ca,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x1cb,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x1cc,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x1cd,UNITY_DISPLAY_STYLE_INT);
    cio_eventloop_destroy(&local_500);
    UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x1d0,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0x1c9);
}

Assistant:

static void test_register_event_fails(void)
{
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_save, epoll_ctl_save, epoll_ctl_mod_fail};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	static const int fake_fd = 42;
	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	struct cio_event_notifier ev;
	ev.fd = fake_fd;
	ev.read_callback = NULL;
	ev.context = NULL;
	err = cio_linux_eventloop_add(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_linux_eventloop_register_read(&loop, &ev);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(4, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}